

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDataAllocator::InitializeChunkState
          (ColumnDataAllocator *this,ChunkManagementState *state,ChunkMetaData *chunk)

{
  __node_base *p_Var1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  uint uVar5;
  __node_base_ptr p_Var6;
  mapped_type *this_00;
  __hash_code __code;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BufferHandle>,_false> __it;
  _Hash_node_base *p_Var10;
  ulong local_48;
  BufferHandle local_40;
  
  if ((this->type & ~HYBRID) == BUFFER_MANAGER_ALLOCATOR) {
    p_Var1 = &(state->handles)._M_h._M_before_begin;
    __it._M_cur = (__node_type *)p_Var1;
    while (__it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt,
          __it._M_cur != (__node_type *)0x0) {
      uVar5 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                        (*(unsigned_long *)((long)__it._M_cur + 8));
      uVar2 = (chunk->block_ids)._M_h._M_bucket_count;
      uVar8 = (ulong)uVar5 % uVar2;
      p_Var3 = (chunk->block_ids)._M_h._M_buckets[uVar8];
      p_Var6 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var6 = p_Var3, p_Var9 = p_Var3->_M_nxt, uVar5 != *(uint *)&p_Var3->_M_nxt[1]._M_nxt)) {
        while (p_Var10 = p_Var9->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
          p_Var6 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar2 != uVar8) ||
             (p_Var6 = p_Var9, p_Var9 = p_Var10, uVar5 == *(uint *)&p_Var10[1]._M_nxt))
          goto LAB_00da5003;
        }
        p_Var6 = (__node_base_ptr)0x0;
      }
LAB_00da5003:
      if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)state,(const_iterator)__it._M_cur);
        __it._M_cur = (__node_type *)p_Var1;
      }
    }
    p_Var10 = (chunk->block_ids)._M_h._M_before_begin._M_nxt;
    if (p_Var10 != (_Hash_node_base *)0x0) {
      do {
        p_Var7 = (_Hash_node_base *)(ulong)*(uint *)&p_Var10[1]._M_nxt;
        uVar2 = (state->handles)._M_h._M_bucket_count;
        uVar8 = (ulong)p_Var7 % uVar2;
        p_Var3 = (state->handles)._M_h._M_buckets[uVar8];
        p_Var6 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var6 = p_Var3, p_Var9 = p_Var3->_M_nxt, p_Var3->_M_nxt[1]._M_nxt != p_Var7)) {
          while (p_Var4 = p_Var9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            p_Var6 = (__node_base_ptr)0x0;
            if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar8) ||
               (p_Var6 = p_Var9, p_Var9 = p_Var4, p_Var4[1]._M_nxt == p_Var7)) goto LAB_00da5090;
          }
          p_Var6 = (__node_base_ptr)0x0;
        }
LAB_00da5090:
        if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
          Pin(&local_40,this,*(uint32_t *)&p_Var10[1]._M_nxt);
          local_48 = (ulong)*(uint *)&p_Var10[1]._M_nxt;
          this_00 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)state,&local_48);
          BufferHandle::operator=(this_00,&local_40);
          BufferHandle::~BufferHandle(&local_40);
        }
        p_Var10 = p_Var10->_M_nxt;
      } while (p_Var10 != (_Hash_node_base *)0x0);
    }
  }
  return;
}

Assistant:

void ColumnDataAllocator::InitializeChunkState(ChunkManagementState &state, ChunkMetaData &chunk) {
	if (type != ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR && type != ColumnDataAllocatorType::HYBRID) {
		// nothing to pin
		return;
	}
	// release any handles that are no longer required
	bool found_handle;
	do {
		found_handle = false;
		for (auto it = state.handles.begin(); it != state.handles.end(); it++) {
			if (chunk.block_ids.find(NumericCast<uint32_t>(it->first)) != chunk.block_ids.end()) {
				// still required: do not release
				continue;
			}
			state.handles.erase(it);
			found_handle = true;
			break;
		}
	} while (found_handle);

	// grab any handles that are now required
	for (auto &block_id : chunk.block_ids) {
		if (state.handles.find(block_id) != state.handles.end()) {
			// already pinned: don't need to do anything
			continue;
		}
		state.handles[block_id] = Pin(block_id);
	}
}